

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QCss::StyleRule>::emplace<QCss::StyleRule_const&>
          (QMovableArrayOps<QCss::StyleRule> *this,qsizetype i,StyleRule *args)

{
  qsizetype *pqVar1;
  StyleRule **ppSVar2;
  StyleRule *pSVar3;
  Data *pDVar4;
  long lVar5;
  StyleRule *pSVar6;
  Data *pDVar7;
  Data *pDVar8;
  long in_FS_OFFSET;
  bool bVar9;
  StyleRule tmp;
  QArrayDataPointer<QCss::Selector> local_68;
  QArrayDataPointer<QCss::Declaration> QStack_50;
  int local_38;
  undefined4 uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>.
           d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0038cfcc:
    local_68.d = (args->selectors).d.d;
    local_68.ptr = (args->selectors).d.ptr;
    local_68.size = (args->selectors).d.size;
    if (local_68.d != (Data *)0x0) {
      LOCK();
      ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QStack_50.d = (args->declarations).d.d;
    QStack_50.ptr = (args->declarations).d.ptr;
    QStack_50.size = (args->declarations).d.size;
    if (QStack_50.d != (Data *)0x0) {
      LOCK();
      ((QStack_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((QStack_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    _local_38 = CONCAT44(0xaaaaaaaa,args->order);
    bVar9 = (this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>
            .size != 0;
    QArrayDataPointer<QCss::StyleRule>::detachAndGrow
              ((QArrayDataPointer<QCss::StyleRule> *)this,(uint)(i == 0 && bVar9),1,
               (StyleRule **)0x0,(QArrayDataPointer<QCss::StyleRule> *)0x0);
    pSVar6 = (this->super_QGenericArrayOps<QCss::StyleRule>).
             super_QArrayDataPointer<QCss::StyleRule>.ptr;
    if (i == 0 && bVar9) {
      pSVar6[-1].selectors.d.d = local_68.d;
      pSVar6[-1].selectors.d.ptr = local_68.ptr;
      pSVar6[-1].selectors.d.size = local_68.size;
      pSVar6[-1].declarations.d.d = QStack_50.d;
      pSVar6[-1].declarations.d.ptr = QStack_50.ptr;
      pSVar6[-1].declarations.d.size = QStack_50.size;
      pSVar6[-1].order = local_38;
      (this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>.ptr =
           pSVar6 + -1;
    }
    else {
      pSVar3 = pSVar6 + i;
      memmove(pSVar3 + 1,pSVar6 + i,
              ((this->super_QGenericArrayOps<QCss::StyleRule>).
               super_QArrayDataPointer<QCss::StyleRule>.size - i) * 0x38);
      (pSVar3->selectors).d.d = local_68.d;
      (pSVar3->selectors).d.ptr = local_68.ptr;
      (pSVar3->selectors).d.size = local_68.size;
      (pSVar3->declarations).d.d = QStack_50.d;
      (pSVar3->declarations).d.ptr = QStack_50.ptr;
      (pSVar3->declarations).d.size = QStack_50.size;
      pSVar3->order = local_38;
    }
    QStack_50.size = 0;
    QStack_50.ptr = (Declaration *)0x0;
    QStack_50.d = (Data *)0x0;
    local_68.size = 0;
    local_68.ptr = (Selector *)0x0;
    local_68.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
              super_QArrayDataPointer<QCss::StyleRule>.size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&QStack_50);
    QArrayDataPointer<QCss::Selector>::~QArrayDataPointer(&local_68);
  }
  else {
    lVar5 = (this->super_QGenericArrayOps<QCss::StyleRule>).super_QArrayDataPointer<QCss::StyleRule>
            .size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QGenericArrayOps<QCss::StyleRule>).
                      super_QArrayDataPointer<QCss::StyleRule>.ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x6db6db6db6db6db7)) {
      pSVar6 = (this->super_QGenericArrayOps<QCss::StyleRule>).
               super_QArrayDataPointer<QCss::StyleRule>.ptr;
      pDVar7 = (args->selectors).d.d;
      pSVar6[lVar5].selectors.d.d = pDVar7;
      pSVar6[lVar5].selectors.d.ptr = (args->selectors).d.ptr;
      pSVar6[lVar5].selectors.d.size = (args->selectors).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar8 = (args->declarations).d.d;
      pSVar6[lVar5].declarations.d.d = pDVar8;
      pSVar6[lVar5].declarations.d.ptr = (args->declarations).d.ptr;
      pSVar6[lVar5].declarations.d.size = (args->declarations).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pSVar6[lVar5].order = args->order;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((StyleRule *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QGenericArrayOps<QCss::StyleRule>).
             super_QArrayDataPointer<QCss::StyleRule>.ptr)) goto LAB_0038cfcc;
      pSVar6 = (this->super_QGenericArrayOps<QCss::StyleRule>).
               super_QArrayDataPointer<QCss::StyleRule>.ptr;
      pDVar7 = (args->selectors).d.d;
      pSVar6[-1].selectors.d.d = pDVar7;
      pSVar6[-1].selectors.d.ptr = (args->selectors).d.ptr;
      pSVar6[-1].selectors.d.size = (args->selectors).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar8 = (args->declarations).d.d;
      pSVar6[-1].declarations.d.d = pDVar8;
      pSVar6[-1].declarations.d.ptr = (args->declarations).d.ptr;
      pSVar6[-1].declarations.d.size = (args->declarations).d.size;
      if (pDVar8 != (Data *)0x0) {
        LOCK();
        (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pSVar6[-1].order = args->order;
      ppSVar2 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
                 super_QArrayDataPointer<QCss::StyleRule>.ptr;
      *ppSVar2 = *ppSVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::StyleRule>).
              super_QArrayDataPointer<QCss::StyleRule>.size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }